

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::ResultBuilder::
binary_assert<0,supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
          (ResultBuilder *this,KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *lhs,
          KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *rhs)

{
  bool bVar1;
  ContextOptions *pCVar2;
  KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *in_R8;
  String SStack_38;
  
  bVar1 = std::operator==((array<unsigned_char,_1UL> *)lhs,(array<unsigned_char,_1UL> *)rhs);
  (this->super_AssertData).m_failed = !bVar1;
  if ((bVar1) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>,supermap::KeyValue<supermap::Key<1ul>,supermap::ByteArray<1ul>>>
            (&SStack_38,(detail *)lhs,
             (KeyValue<supermap::Key<1UL>,_supermap::ByteArray<1UL>_> *)0x1a184a,(char *)rhs,in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }